

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O3

shared_ptr<helics::FilterOperator> __thiscall
helics::RandomDelayFilterOperation::getOperator(RandomDelayFilterOperation *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<helics::FilterOperator> sVar2;
  shared_ptr<helics::FilterOperator> sVar3;
  
  in_RDI->_vptr_FilterOperator =
       (_func_int **)
       (this->td).super___shared_ptr<helics::MessageTimeOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  p_Var1 = (this->td).super___shared_ptr<helics::MessageTimeOperator,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  in_RDI[1]._vptr_FilterOperator = (_func_int **)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      sVar2.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar2.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<helics::FilterOperator>)
             sVar2.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  sVar3.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar3.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<helics::FilterOperator>)
         sVar3.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FilterOperator> RandomDelayFilterOperation::getOperator()
{
    return std::static_pointer_cast<FilterOperator>(td);
}